

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O3

bool __thiscall cmGeneratedFileStreamBase::Close(cmGeneratedFileStreamBase *this)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  cmGeneratedFileStreamBase *this_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string resname;
  string gzname;
  string local_78;
  undefined1 local_58 [40];
  pointer local_30;
  undefined1 local_28 [16];
  
  pcVar1 = (this->Name)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,pcVar1 + (this->Name)._M_string_length);
  if ((this->Compress == true) && (this->CompressExtraExtension == true)) {
    std::__cxx11::string::append((char *)&local_78);
  }
  if (((this->Name)._M_string_length == 0) || (this->Okay != true)) {
LAB_001a1833:
    bVar2 = false;
  }
  else {
    if (this->CopyIfDifferent == true) {
      bVar2 = cmsys::SystemTools::FilesDiffer(&this->TempName,&local_78);
      if (!bVar2) goto LAB_001a1833;
    }
    if (this->Compress == true) {
      local_30 = (this->TempName)._M_dataplus._M_p;
      local_58._32_8_ = (this->TempName)._M_string_length;
      local_28._0_8_ = 8;
      local_28._8_8_ = ".temp.gz";
      this_00 = (cmGeneratedFileStreamBase *)local_58;
      views._M_len = 2;
      views._M_array = (iterator)(local_58 + 0x20);
      cmCatViews_abi_cxx11_((string *)this_00,views);
      iVar3 = CompressFile(this_00,&this->TempName,(string *)local_58);
      if (iVar3 != 0) {
        cmSystemTools::RenameFile((string *)local_58,&local_78);
      }
      cmsys::SystemTools::RemoveFile((string *)local_58);
      if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
        operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
      }
      bVar2 = true;
    }
    else {
      bVar2 = true;
      cmSystemTools::RenameFile(&this->TempName,&local_78);
    }
  }
  if ((this->TempName)._M_string_length != 0) {
    cmsys::SystemTools::RemoveFile(&this->TempName);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmGeneratedFileStreamBase::Close()
{
  bool replaced = false;

  std::string resname = this->Name;
  if (this->Compress && this->CompressExtraExtension) {
    resname += ".gz";
  }

  // Only consider replacing the destination file if no error
  // occurred.
  if (!this->Name.empty() && this->Okay &&
      (!this->CopyIfDifferent ||
       cmSystemTools::FilesDiffer(this->TempName, resname))) {
    // The destination is to be replaced.  Rename the temporary to the
    // destination atomically.
    if (this->Compress) {
      std::string gzname = cmStrCat(this->TempName, ".temp.gz");
      if (this->CompressFile(this->TempName, gzname)) {
        this->RenameFile(gzname, resname);
      }
      cmSystemTools::RemoveFile(gzname);
    } else {
      this->RenameFile(this->TempName, resname);
    }

    replaced = true;
  }

  // Else, the destination was not replaced.
  //
  // Always delete the temporary file. We never want it to stay around.
  if (!this->TempName.empty()) {
    cmSystemTools::RemoveFile(this->TempName);
  }

  return replaced;
}